

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

TRANSFER_HANDLE transfer_clone(TRANSFER_HANDLE value)

{
  AMQP_VALUE pAVar1;
  TRANSFER_HANDLE local_18;
  TRANSFER_INSTANCE *transfer_instance;
  TRANSFER_HANDLE value_local;
  
  local_18 = (TRANSFER_HANDLE)malloc(8);
  if (local_18 != (TRANSFER_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    local_18->composite_value = pAVar1;
    if (local_18->composite_value == (AMQP_VALUE)0x0) {
      free(local_18);
      local_18 = (TRANSFER_HANDLE)0x0;
    }
  }
  return local_18;
}

Assistant:

TRANSFER_HANDLE transfer_clone(TRANSFER_HANDLE value)
{
    TRANSFER_INSTANCE* transfer_instance = (TRANSFER_INSTANCE*)malloc(sizeof(TRANSFER_INSTANCE));
    if (transfer_instance != NULL)
    {
        transfer_instance->composite_value = amqpvalue_clone(((TRANSFER_INSTANCE*)value)->composite_value);
        if (transfer_instance->composite_value == NULL)
        {
            free(transfer_instance);
            transfer_instance = NULL;
        }
    }

    return transfer_instance;
}